

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_socket_setup_ipv6(int sock)

{
  int iVar1;
  uint uVar2;
  undefined1 local_4c;
  undefined1 local_4b;
  ipv6_mreq req;
  uint loopback;
  int hops;
  int flags;
  sockaddr_in6 saddr;
  int sock_local;
  
  saddr.sin6_addr.__in6_u.__u6_addr32[3] = sock;
  memset(&hops,0,0x1c);
  hops._0_2_ = 10;
  saddr.sin6_family = _in6addr_any;
  saddr.sin6_port = in6addr_any_2;
  saddr.sin6_flowinfo = uRam00000000004727d4;
  saddr.sin6_addr.__in6_u._0_8_ = _length;
  iVar1 = bind(saddr.sin6_addr.__in6_u.__u6_addr32[3],(sockaddr *)&hops,0x1c);
  if (iVar1 == 0) {
    uVar2 = fcntl(saddr.sin6_addr.__in6_u.__u6_addr32[3],3,0);
    fcntl(saddr.sin6_addr.__in6_u.__u6_addr32[3],4,(ulong)(uVar2 | 0x800));
    req.ipv6mr_interface = 1;
    req.ipv6mr_multiaddr.__in6_u.__u6_addr32[3] = 1;
    setsockopt(saddr.sin6_addr.__in6_u.__u6_addr32[3],0x29,0x12,&req.ipv6mr_interface,4);
    setsockopt(saddr.sin6_addr.__in6_u.__u6_addr32[3],0x29,0x13,
               (void *)((long)&req.ipv6mr_multiaddr.__in6_u + 0xc),4);
    memset(&local_4c,0,0x14);
    local_4c = 0xff;
    local_4b = 2;
    req.ipv6mr_multiaddr.__in6_u.__u6_addr8[7] = 0xfb;
    iVar1 = setsockopt(saddr.sin6_addr.__in6_u.__u6_addr32[3],0x29,0x14,&local_4c,0x14);
    if (iVar1 == 0) {
      saddr.sin6_scope_id = 0;
    }
    else {
      saddr.sin6_scope_id = 0xffffffff;
    }
  }
  else {
    saddr.sin6_scope_id = 0xffffffff;
  }
  return saddr.sin6_scope_id;
}

Assistant:

int
mdns_socket_setup_ipv6(int sock) {
	struct sockaddr_in6 saddr;
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin6_family = AF_INET6;
	saddr.sin6_addr = in6addr_any;
#ifdef __APPLE__
	saddr.sin6_len = sizeof(saddr);
#endif

	if (bind(sock, (struct sockaddr*)&saddr, sizeof(saddr)))
		return -1;

#ifdef _WIN32
	unsigned long param = 1;
	ioctlsocket(sock, FIONBIO, &param);
#else
	const int flags = fcntl(sock, F_GETFL, 0);
	fcntl(sock, F_SETFL, flags | O_NONBLOCK);
#endif

	int hops = 1;
	unsigned int loopback = 1;
	struct ipv6_mreq req;

	setsockopt(sock, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, (const char*)&hops, sizeof(hops));
	setsockopt(sock, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, (const char*)&loopback, sizeof(loopback));

	memset(&req, 0, sizeof(req));
	req.ipv6mr_multiaddr.s6_addr[0] = 0xFF;
	req.ipv6mr_multiaddr.s6_addr[1] = 0x02;
	req.ipv6mr_multiaddr.s6_addr[15] = 0xFB;
	if (setsockopt(sock, IPPROTO_IPV6, IPV6_JOIN_GROUP, (char*)&req, sizeof(req)))
		return -1;

	return 0;
}